

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::
AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest> *this,
          string *instantiation_name,GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,
          char *file,int line)

{
  pointer *ppIVar1;
  pointer pIVar2;
  pointer __first;
  int iVar3;
  ulong uVar4;
  pointer __result;
  pointer pIVar5;
  pointer pIVar6;
  _Tp_alloc_type *__alloc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  undefined4 uVar9;
  ulong uVar10;
  _Tp_alloc_type *local_70;
  size_type local_68;
  _Tp_alloc_type local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  GeneratorCreationFunc *local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  uVar9 = SUB84(file,0);
  std::__cxx11::string::string((string *)&local_70,(string *)instantiation_name);
  uStack_48._4_4_ = (undefined4)((ulong)name_func >> 0x20);
  local_40 = 0xb7afdf;
  uStack_3c = 0;
  pIVar6 = (this->instantiations_).
           super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = func;
  local_38 = uVar9;
  if (pIVar6 == (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->instantiations_).
              super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uStack_48 = name_func;
    if ((long)pIVar6 - (long)__first == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)pIVar6 - (long)__first >> 6;
    uVar4 = 1;
    if (pIVar6 != __first) {
      uVar4 = uVar10;
    }
    uVar8 = uVar4 + uVar10;
    if (0x1fffffffffffffe < uVar8) {
      uVar8 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar4,uVar10)) {
      uVar8 = 0x1ffffffffffffff;
    }
    if (uVar8 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar8 << 6);
      name_func = uStack_48;
    }
    uStack_48._4_4_ = (undefined4)((ulong)name_func >> 0x20);
    pIVar5 = __result + uVar10;
    pIVar2 = __result + uVar10;
    paVar7 = &(pIVar2->name).field_2;
    (pIVar2->name)._M_dataplus._M_p = (pointer)paVar7;
    __alloc = &local_60;
    if (local_70 == __alloc) {
      paVar7->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)((long)&(pIVar2->name).field_2 + 8) = uStack_58;
    }
    else {
      (pIVar5->name)._M_dataplus._M_p = (pointer)local_70;
      (pIVar5->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (pIVar5->name)._M_string_length = local_68;
    local_68 = 0;
    local_60 = (_Tp_alloc_type)0x0;
    *(ulong *)((long)&pIVar5->name_func + 4) = CONCAT44(local_40,uStack_48._4_4_);
    *(ulong *)((long)&pIVar5->file + 4) = CONCAT44(local_38,uStack_3c);
    pIVar5->generator = local_50;
    pIVar5->name_func = name_func;
    local_70 = __alloc;
    uStack_48 = name_func;
    pIVar5 = std::
             vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
             ::_S_relocate(__first,pIVar6,__result,__alloc);
    pIVar6 = std::
             vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
             ::_S_relocate(pIVar6,pIVar6,pIVar5 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar8;
    name_func = uStack_48;
  }
  else {
    paVar7 = &(pIVar6->name).field_2;
    (pIVar6->name)._M_dataplus._M_p = (pointer)paVar7;
    if (local_70 == &local_60) {
      paVar7->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)((long)&(pIVar6->name).field_2 + 8) = uStack_58;
    }
    else {
      (pIVar6->name)._M_dataplus._M_p = (pointer)local_70;
      (pIVar6->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (pIVar6->name)._M_string_length = local_68;
    local_68 = 0;
    local_60 = (_Tp_alloc_type)0x0;
    *(ulong *)((long)&pIVar6->name_func + 4) = CONCAT44(0xb7afdf,uStack_48._4_4_);
    *(long *)((long)&pIVar6->file + 4) = (long)file << 0x20;
    pIVar6->generator = func;
    pIVar6->name_func = name_func;
    ppIVar1 = &(this->instantiations_).
               super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SumSquaresTest>::InstantiationInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
    local_70 = &local_60;
  }
  uStack_48 = name_func;
  iVar3 = std::__cxx11::string::~string((string *)&local_70);
  return iVar3;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }